

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

VarTerm * new_var_term(Token *name,void *expr,Type *type,Modifier *modifier)

{
  Token *pTVar1;
  void *any;
  VarTerm *pVVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x28);
  pVVar2 = (VarTerm *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node(name,var_eval);
  pTVar1 = pTVar3->token;
  (pVVar2->node).eval = pTVar3->eval;
  (pVVar2->node).token = pTVar1;
  pVVar2->value = expr;
  pVVar2->modifier = modifier;
  pVVar2->type = type;
  return pVVar2;
}

Assistant:

VarTerm *new_var_term(Token *name, void *expr, Type* type, Modifier* modifier) {
    VarTerm *term = new(VarTerm);
    term->node = tree_node_(name, eval_handler(var_eval));
    term->value = expr;
    term->modifier = modifier;
    term->type = type;
    return term;
}